

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

Instr * __thiscall
BackwardPass::ProcessPendingPreOpBailOutInfo(BackwardPass *this,Instr *currentInstr)

{
  uint32 uVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  BailOutInfo *bailOutInfo;
  Instr *pIVar7;
  Instr *instr;
  Instr *instr_00;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xa18,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar4) goto LAB_003ca072;
    *puVar6 = 0;
  }
  pIVar7 = this->preOpBailOutInstrToProcess;
  if (pIVar7 != (Instr *)0x0) {
    if (pIVar7 != currentInstr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa1e,"(preOpBailOutInstrToProcess == currentInstr)",
                         "preOpBailOutInstrToProcess == currentInstr");
      if (!bVar4) goto LAB_003ca072;
      *puVar6 = 0;
      pIVar7 = this->preOpBailOutInstrToProcess;
    }
    if (this->currentPrePassLoop == (Loop *)0x0) {
      instr_00 = pIVar7->m_prev;
      while (instr_00 != (Instr *)0x0) {
        bVar4 = IR::Instr::CanAggregateByteCodeUsesAcrossInstr(pIVar7,instr_00);
        pIVar7 = this->preOpBailOutInstrToProcess;
        if (!bVar4) break;
        pIVar2 = instr_00->m_prev;
        bVar4 = IR::Instr::IsByteCodeUsesInstrFor(instr_00,pIVar7);
        if (bVar4) {
          ProcessByteCodeUsesInstr(this,instr_00);
        }
        pIVar7 = this->preOpBailOutInstrToProcess;
        instr_00 = pIVar2;
      }
    }
    bailOutInfo = IR::Instr::GetBailOutInfo(pIVar7);
    pIVar7 = this->preOpBailOutInstrToProcess;
    if (bailOutInfo->bailOutInstr != pIVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa32,"(bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess)",
                         "bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess");
      if (!bVar4) goto LAB_003ca072;
      *puVar6 = 0;
      pIVar7 = this->preOpBailOutInstrToProcess;
    }
    uVar1 = bailOutInfo->bailOutOffset;
    uVar5 = IR::Instr::GetByteCodeOffset(pIVar7);
    if (uVar1 != uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa33,
                         "(bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset())"
                         ,
                         "bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset()"
                        );
      if (!bVar4) {
LAB_003ca072:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    ProcessBailOutInfo(this,this->preOpBailOutInstrToProcess,bailOutInfo);
    this->preOpBailOutInstrToProcess = (Instr *)0x0;
  }
  return currentInstr->m_prev;
}

Assistant:

IR::Instr*
BackwardPass::ProcessPendingPreOpBailOutInfo(IR::Instr *const currentInstr)
{
    Assert(!IsCollectionPass());

    if(!preOpBailOutInstrToProcess)
    {
        return currentInstr->m_prev;
    }
    Assert(preOpBailOutInstrToProcess == currentInstr);

    if (!this->IsPrePass())
    {
        IR::Instr* prev = preOpBailOutInstrToProcess->m_prev;
        while (prev && preOpBailOutInstrToProcess->CanAggregateByteCodeUsesAcrossInstr(prev))
        {
            IR::Instr* instr = prev;
            prev = prev->m_prev;
            if (instr->IsByteCodeUsesInstrFor(preOpBailOutInstrToProcess))
            {
                // If instr is a ByteCodeUsesInstr, it will remove it
                ProcessByteCodeUsesInstr(instr);
            }
        }
    }

    // A pre-op bailout instruction was saved for bailout info processing after the instruction and relevant ByteCodeUses
    // instructions before it have been processed. We can process the bailout info for that instruction now.
    BailOutInfo *const bailOutInfo = preOpBailOutInstrToProcess->GetBailOutInfo();
    Assert(bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess);
    Assert(bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset());
    ProcessBailOutInfo(preOpBailOutInstrToProcess, bailOutInfo);
    preOpBailOutInstrToProcess = nullptr;

    // We might have removed the prev instr if it was a ByteCodeUsesInstr
    // Update the prevInstr on the main loop
    return currentInstr->m_prev;
}